

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::fixup_store_type_atomic
          (Impl *this,ComponentType component_type,uint components,Id value)

{
  ComponentType input_type;
  Id IVar1;
  ComponentType output_component_type;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,component_type);
  if (iVar2 == 2) {
    input_type = U16;
  }
  else if (iVar2 == 6) {
    input_type = U64;
  }
  else {
    if (iVar2 != 4) {
      return value;
    }
    input_type = U32;
  }
  if (input_type == component_type) {
    return value;
  }
  IVar1 = build_value_cast(this,value,input_type,component_type,components);
  return IVar1;
}

Assistant:

spv::Id Converter::Impl::fixup_store_type_atomic(DXIL::ComponentType component_type, unsigned components, spv::Id value)
{
	auto output_component_type = component_type;
	auto input_component_type = component_type;

	input_component_type = convert_component_to_unsigned(input_component_type);

	if (output_component_type != input_component_type)
		value = build_value_cast(value, input_component_type, output_component_type, components);
	return value;
}